

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testRgba.cpp
# Opt level: O2

void anon_unknown.dwarf_2504c3::writeReadLayers(string *tempDir,bool multiPart)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  pointer pFVar4;
  _Alloc_hider _Var5;
  int iVar6;
  ostream *poVar7;
  pointer pHVar8;
  undefined1 *puVar9;
  long lVar10;
  ulong uVar11;
  undefined7 in_register_00000031;
  char *pcVar12;
  ulong uVar13;
  half *phVar14;
  long lVar15;
  half *phVar16;
  ulong uVar17;
  uint uVar18;
  ulong uVar19;
  OutputPart part0;
  vector<Imf_3_2::FrameBuffer,_std::allocator<Imf_3_2::FrameBuffer>_> fb;
  MultiPartOutputFile out;
  vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_> headers;
  Array2D<Imath_3_2::half> p2;
  Array2D<Imath_3_2::half> p1;
  string fileName;
  OutputPart part1;
  
  pcVar12 = "\nreading multi-layer file";
  uVar18 = (uint)CONCAT71(in_register_00000031,multiPart);
  if (uVar18 != 0) {
    pcVar12 = "\nreading multi-part file";
  }
  poVar7 = std::operator<<((ostream *)&std::cout,pcVar12);
  std::endl<char,std::char_traits<char>>(poVar7);
  std::operator+(&fileName,tempDir,"imf_test_multi_layer_rgba.exr");
  p1._sizeX = 0x77;
  p1._sizeY = 0xed;
  p1._data = (half *)operator_new__(0xdc56);
  p2._sizeX = 0x77;
  p2._sizeY = 0xed;
  p2._data = (half *)operator_new__(0xdc56);
  lVar10 = 0;
  uVar13 = 0;
  while( true ) {
    uVar11 = (uVar13 & 0xffffffff) % 0x17;
    uVar19 = (uVar13 & 0xffffffff) % 0x1d;
    if (uVar13 == 0x77) break;
    uVar17 = 0;
    while( true ) {
      if (uVar17 == 0xed) break;
      Imath_3_2::half::half
                ((half *)&out,(float)((int)uVar11 + (int)((uVar17 & 0xffffffff) / 0x11) * -0x11));
      *(uint16_t *)((long)&p1._data[uVar17]._h + p1._sizeY * lVar10) = _out;
      Imath_3_2::half::half
                ((half *)&out,(float)((int)uVar19 + (int)((uVar17 & 0xffffffff) / 0x13) * -0x13));
      *(uint16_t *)((long)&p2._data[uVar17]._h + p2._sizeY * lVar10) = _out;
      uVar17 = uVar17 + 1;
      uVar11 = (ulong)((int)uVar11 + 1);
      uVar19 = (ulong)((int)uVar19 + 1);
    }
    uVar13 = uVar13 + 1;
    lVar10 = lVar10 + 2;
  }
  std::vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>::vector
            (&headers,2,(allocator_type *)&out);
  fb.super__Vector_base<Imf_3_2::FrameBuffer,_std::allocator<Imf_3_2::FrameBuffer>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  Imf_3_2::Header::Header((Header *)&out,0xed,0x77,1.0,(Vec2 *)&fb,1.0,INCREASING_Y,ZIP_COMPRESSION)
  ;
  Imf_3_2::Header::setType((string *)&out);
  Imf_3_2::Header::operator=
            (headers.super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>._M_impl.
             super__Vector_impl_data._M_start,(Header *)&out);
  pHVar8 = headers.super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>._M_impl.
           super__Vector_impl_data._M_start;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fb,"rgba_layer",(allocator<char> *)&part0);
  Imf_3_2::Header::setName((string *)pHVar8);
  std::__cxx11::string::~string((string *)&fb);
  if (multiPart) {
    Imf_3_2::Header::operator=
              (headers.super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>._M_impl
               .super__Vector_impl_data._M_start + 0x38,(Header *)&out);
    pHVar8 = headers.super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>._M_impl.
             super__Vector_impl_data._M_start;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&fb,"foo_layer",(allocator<char> *)&part0);
    Imf_3_2::Header::setName((string *)(pHVar8 + 0x38));
    std::__cxx11::string::~string((string *)&fb);
  }
  Imf_3_2::Header::~Header((Header *)&out);
  pcVar12 = (char *)Imf_3_2::Header::channels();
  Imf_3_2::Channel::Channel((Channel *)&out,HALF,1,1,false);
  Imf_3_2::ChannelList::insert(pcVar12,(Channel *)0x19f8c3);
  uVar18 = uVar18 & 0xff;
  pcVar12 = (char *)Imf_3_2::Header::channels();
  Imf_3_2::Channel::Channel((Channel *)&out,HALF,1,1,false);
  Imf_3_2::ChannelList::insert(pcVar12,(Channel *)"foo.R");
  std::vector<Imf_3_2::FrameBuffer,_std::allocator<Imf_3_2::FrameBuffer>_>::vector
            (&fb,2,(allocator_type *)&out);
  pFVar4 = fb.super__Vector_base<Imf_3_2::FrameBuffer,_std::allocator<Imf_3_2::FrameBuffer>_>.
           _M_impl.super__Vector_impl_data._M_start;
  Imf_3_2::Slice::Slice((Slice *)&out,HALF,(char *)p1._data,2,0x1da,1,1,0.0,false,false);
  Imf_3_2::FrameBuffer::insert((char *)pFVar4,(Slice *)0x19f8c3);
  pFVar4 = fb.super__Vector_base<Imf_3_2::FrameBuffer,_std::allocator<Imf_3_2::FrameBuffer>_>.
           _M_impl.super__Vector_impl_data._M_start;
  Imf_3_2::Slice::Slice((Slice *)&out,HALF,(char *)p2._data,2,0x1da,1,1,0.0,false,false);
  Imf_3_2::FrameBuffer::insert((char *)(pFVar4 + uVar18),(Slice *)"foo.R");
  _Var5 = fileName._M_dataplus;
  iVar6 = Imf_3_2::globalThreadCount();
  Imf_3_2::MultiPartOutputFile::MultiPartOutputFile
            (&out,_Var5._M_p,
             headers.super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>._M_impl.
             super__Vector_impl_data._M_start,uVar18 + 1,false,iVar6);
  Imf_3_2::OutputPart::OutputPart(&part0,&out,0);
  Imf_3_2::OutputPart::setFrameBuffer((FrameBuffer *)&part0);
  Imf_3_2::OutputPart::writePixels((int)&part0);
  if (multiPart) {
    Imf_3_2::OutputPart::OutputPart(&part1,&out,1);
    Imf_3_2::OutputPart::setFrameBuffer((FrameBuffer *)&part1);
    Imf_3_2::OutputPart::writePixels((int)&part1);
  }
  Imf_3_2::MultiPartOutputFile::~MultiPartOutputFile(&out);
  std::vector<Imf_3_2::FrameBuffer,_std::allocator<Imf_3_2::FrameBuffer>_>::~vector(&fb);
  std::vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>::~vector(&headers);
  headers.super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x77;
  headers.super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0xed;
  headers.super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)operator_new__(0x37158);
  _Var5 = fileName._M_dataplus;
  if (multiPart) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&fb,"",(allocator<char> *)&part0);
    iVar6 = Imf_3_2::globalThreadCount();
    Imf_3_2::RgbaInputFile::RgbaInputFile((RgbaInputFile *)&out,_Var5._M_p,(string *)&fb,iVar6);
    std::__cxx11::string::~string((string *)&fb);
    Imf_3_2::RgbaInputFile::setFrameBuffer
              ((Rgba *)&out,
               (ulong)headers.super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,1);
    Imf_3_2::RgbaInputFile::readPixels((int)&out,0);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&fb,"",(allocator<char> *)&part0);
    iVar6 = Imf_3_2::globalThreadCount();
    Imf_3_2::RgbaInputFile::RgbaInputFile((RgbaInputFile *)&out,0,_Var5._M_p,(string *)&fb,iVar6);
    std::__cxx11::string::~string((string *)&fb);
    Imf_3_2::RgbaInputFile::setFrameBuffer
              ((Rgba *)&out,
               (ulong)headers.super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,1);
    Imf_3_2::RgbaInputFile::readPixels((int)&out,0);
  }
  Imf_3_2::RgbaInputFile::~RgbaInputFile((RgbaInputFile *)&out);
  pHVar8 = headers.super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 6;
  lVar10 = 0;
  phVar14 = p1._data;
  do {
    if (lVar10 == 0x77) {
      Imf_3_2::Array2D<Imf_3_2::Rgba>::~Array2D((Array2D<Imf_3_2::Rgba> *)&headers);
      headers.super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x77;
      headers.super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0xed;
      headers.super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)operator_new__(0x37158);
      _Var5 = fileName._M_dataplus;
      if (multiPart) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&fb,"foo",(allocator<char> *)&part0);
        iVar6 = Imf_3_2::globalThreadCount();
        Imf_3_2::RgbaInputFile::RgbaInputFile
                  ((RgbaInputFile *)&out,1,_Var5._M_p,(string *)&fb,iVar6);
        std::__cxx11::string::~string((string *)&fb);
        Imf_3_2::RgbaInputFile::setFrameBuffer
                  ((Rgba *)&out,
                   (ulong)headers.
                          super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,1);
        Imf_3_2::RgbaInputFile::readPixels((int)&out,0);
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&fb,"foo",(allocator<char> *)&part0);
        iVar6 = Imf_3_2::globalThreadCount();
        Imf_3_2::RgbaInputFile::RgbaInputFile((RgbaInputFile *)&out,_Var5._M_p,(string *)&fb,iVar6);
        std::__cxx11::string::~string((string *)&fb);
        Imf_3_2::RgbaInputFile::setFrameBuffer
                  ((Rgba *)&out,
                   (ulong)headers.
                          super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,1);
        Imf_3_2::RgbaInputFile::readPixels((int)&out,0);
      }
      Imf_3_2::RgbaInputFile::~RgbaInputFile((RgbaInputFile *)&out);
      pHVar8 = headers.super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>._M_impl
               .super__Vector_impl_data._M_end_of_storage + 6;
      lVar10 = 0;
      phVar14 = p2._data;
      do {
        if (lVar10 == 0x77) {
          Imf_3_2::Array2D<Imf_3_2::Rgba>::~Array2D((Array2D<Imf_3_2::Rgba> *)&headers);
          headers.super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x77;
          headers.super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0xed;
          headers.super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)operator_new__(0x37158);
          _Var5 = fileName._M_dataplus;
          if (multiPart) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&fb,"",(allocator<char> *)&part0);
            iVar6 = Imf_3_2::globalThreadCount();
            Imf_3_2::RgbaInputFile::RgbaInputFile
                      ((RgbaInputFile *)&out,_Var5._M_p,(string *)&fb,iVar6);
            std::__cxx11::string::~string((string *)&fb);
            Imf_3_2::RgbaInputFile::setFrameBuffer
                      ((Rgba *)&out,
                       (ulong)headers.
                              super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage,1);
            Imf_3_2::RgbaInputFile::readPixels((int)&out,0);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&fb,"foo",(allocator<char> *)&part0);
            Imf_3_2::RgbaInputFile::setPartAndLayer((int)&out,(string *)0x1);
            std::__cxx11::string::~string((string *)&fb);
            Imf_3_2::RgbaInputFile::setFrameBuffer
                      ((Rgba *)&out,
                       (ulong)headers.
                              super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage,1);
            Imf_3_2::RgbaInputFile::readPixels((int)&out,0x3b);
          }
          else {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&fb,"",(allocator<char> *)&part0);
            iVar6 = Imf_3_2::globalThreadCount();
            Imf_3_2::RgbaInputFile::RgbaInputFile
                      ((RgbaInputFile *)&out,_Var5._M_p,(string *)&fb,iVar6);
            std::__cxx11::string::~string((string *)&fb);
            Imf_3_2::RgbaInputFile::setFrameBuffer
                      ((Rgba *)&out,
                       (ulong)headers.
                              super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage,1);
            Imf_3_2::RgbaInputFile::readPixels((int)&out,0);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&fb,"foo",(allocator<char> *)&part0);
            Imf_3_2::RgbaInputFile::setLayerName((string *)&out);
            std::__cxx11::string::~string((string *)&fb);
            Imf_3_2::RgbaInputFile::setFrameBuffer
                      ((Rgba *)&out,
                       (ulong)headers.
                              super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage,1);
            Imf_3_2::RgbaInputFile::readPixels((int)&out,0x3b);
          }
          Imf_3_2::RgbaInputFile::~RgbaInputFile((RgbaInputFile *)&out);
          pHVar8 = headers.super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage + 6;
          uVar13 = 0;
          phVar14 = p2._data;
          phVar16 = p1._data;
          do {
            if (uVar13 == 0x77) {
              Imf_3_2::Array2D<Imf_3_2::Rgba>::~Array2D((Array2D<Imf_3_2::Rgba> *)&headers);
              if (!multiPart) {
                fb.super__Vector_base<Imf_3_2::FrameBuffer,_std::allocator<Imf_3_2::FrameBuffer>_>.
                _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                Imf_3_2::Header::Header
                          ((Header *)&out,0xed,0x77,1.0,(Vec2 *)&fb,1.0,INCREASING_Y,ZIP_COMPRESSION
                          );
                pcVar12 = (char *)Imf_3_2::Header::channels();
                Imf_3_2::Channel::Channel((Channel *)&fb,HALF,1,1,false);
                Imf_3_2::ChannelList::insert(pcVar12,(Channel *)0x1ab1e2);
                pcVar12 = (char *)Imf_3_2::Header::channels();
                Imf_3_2::Channel::Channel((Channel *)&fb,HALF,1,1,false);
                Imf_3_2::ChannelList::insert(pcVar12,(Channel *)"foo.Y");
                headers.super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>.
                _M_impl.super__Vector_impl_data._M_finish =
                     (pointer)((ulong)headers.
                                      super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>
                                      ._M_impl.super__Vector_impl_data._M_finish &
                              0xffffffff00000000);
                headers.super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                Imf_3_2::Slice::Slice
                          ((Slice *)&fb,HALF,(char *)p1._data,2,0x1da,1,1,0.0,false,false);
                Imf_3_2::FrameBuffer::insert((char *)&headers,(Slice *)0x1ab1e2);
                Imf_3_2::Slice::Slice
                          ((Slice *)&fb,HALF,(char *)p2._data,2,0x1da,1,1,0.0,false,false);
                Imf_3_2::FrameBuffer::insert((char *)&headers,(Slice *)"foo.Y");
                _Var5 = fileName._M_dataplus;
                iVar6 = Imf_3_2::globalThreadCount();
                Imf_3_2::OutputFile::OutputFile((OutputFile *)&fb,_Var5._M_p,(Header *)&out,iVar6);
                Imf_3_2::OutputFile::setFrameBuffer((FrameBuffer *)&fb);
                Imf_3_2::OutputFile::writePixels((int)&fb);
                Imf_3_2::OutputFile::~OutputFile((OutputFile *)&fb);
                std::
                _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                             *)&headers);
                Imf_3_2::Header::~Header((Header *)&out);
                _Var5 = fileName._M_dataplus;
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&fb,"",(allocator<char> *)&headers);
                iVar6 = Imf_3_2::globalThreadCount();
                Imf_3_2::RgbaInputFile::RgbaInputFile
                          ((RgbaInputFile *)&out,_Var5._M_p,(string *)&fb,iVar6);
                std::__cxx11::string::~string((string *)&fb);
                fb.super__Vector_base<Imf_3_2::FrameBuffer,_std::allocator<Imf_3_2::FrameBuffer>_>.
                _M_impl.super__Vector_impl_data._M_start = (pointer)0x77;
                fb.super__Vector_base<Imf_3_2::FrameBuffer,_std::allocator<Imf_3_2::FrameBuffer>_>.
                _M_impl.super__Vector_impl_data._M_finish = (pointer)0xed;
                fb.super__Vector_base<Imf_3_2::FrameBuffer,_std::allocator<Imf_3_2::FrameBuffer>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)operator_new__(0x37158)
                ;
                Imf_3_2::RgbaInputFile::setFrameBuffer
                          ((Rgba *)&out,
                           (ulong)fb.
                                  super__Vector_base<Imf_3_2::FrameBuffer,_std::allocator<Imf_3_2::FrameBuffer>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,1);
                Imf_3_2::RgbaInputFile::readPixels((int)&out,0);
                puVar9 = &((fb.
                            super__Vector_base<Imf_3_2::FrameBuffer,_std::allocator<Imf_3_2::FrameBuffer>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage)->_map)._M_t._M_impl.
                          field_0x6;
                phVar14 = p1._data;
                for (lVar10 = 0; lVar10 != 0x77; lVar10 = lVar10 + 1) {
                  lVar15 = 0;
                  while (lVar15 != 0xed) {
                    fVar2 = *(float *)(_imath_half_to_float_table +
                                      (ulong)*(ushort *)(puVar9 + lVar15 * 8 + -6) * 4);
                    fVar3 = *(float *)(_imath_half_to_float_table + (ulong)phVar14[lVar15]._h * 4);
                    if ((fVar2 != fVar3) || (NAN(fVar2) || NAN(fVar3))) {
                      __assert_fail("p3[y][x].r == p1[y][x]",
                                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgba.cpp"
                                    ,0x236,
                                    "void (anonymous namespace)::writeReadLayers(const std::string &, bool)"
                                   );
                    }
                    fVar2 = *(float *)(_imath_half_to_float_table +
                                      (ulong)*(ushort *)(puVar9 + lVar15 * 8 + -4) * 4);
                    if ((fVar2 != fVar3) || (NAN(fVar2) || NAN(fVar3))) {
                      __assert_fail("p3[y][x].g == p1[y][x]",
                                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgba.cpp"
                                    ,0x237,
                                    "void (anonymous namespace)::writeReadLayers(const std::string &, bool)"
                                   );
                    }
                    fVar2 = *(float *)(_imath_half_to_float_table +
                                      (ulong)*(ushort *)(puVar9 + lVar15 * 8 + -2) * 4);
                    if ((fVar2 != fVar3) || (NAN(fVar2) || NAN(fVar3))) {
                      __assert_fail("p3[y][x].b == p1[y][x]",
                                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgba.cpp"
                                    ,0x238,
                                    "void (anonymous namespace)::writeReadLayers(const std::string &, bool)"
                                   );
                    }
                    fVar2 = *(float *)(_imath_half_to_float_table +
                                      (ulong)*(ushort *)(puVar9 + lVar15 * 8) * 4);
                    lVar15 = lVar15 + 1;
                    if ((fVar2 != 1.0) || (NAN(fVar2))) {
                      __assert_fail("p3[y][x].a == 1",
                                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgba.cpp"
                                    ,0x239,
                                    "void (anonymous namespace)::writeReadLayers(const std::string &, bool)"
                                   );
                    }
                  }
                  phVar14 = phVar14 + p1._sizeY;
                  puVar9 = puVar9 + (long)fb.
                                          super__Vector_base<Imf_3_2::FrameBuffer,_std::allocator<Imf_3_2::FrameBuffer>_>
                                          ._M_impl.super__Vector_impl_data._M_finish * 8;
                }
                Imf_3_2::Array2D<Imf_3_2::Rgba>::~Array2D((Array2D<Imf_3_2::Rgba> *)&fb);
                Imf_3_2::RgbaInputFile::~RgbaInputFile((RgbaInputFile *)&out);
                _Var5 = fileName._M_dataplus;
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&fb,"foo",(allocator<char> *)&headers);
                iVar6 = Imf_3_2::globalThreadCount();
                Imf_3_2::RgbaInputFile::RgbaInputFile
                          ((RgbaInputFile *)&out,_Var5._M_p,(string *)&fb,iVar6);
                std::__cxx11::string::~string((string *)&fb);
                fb.super__Vector_base<Imf_3_2::FrameBuffer,_std::allocator<Imf_3_2::FrameBuffer>_>.
                _M_impl.super__Vector_impl_data._M_start = (pointer)0x77;
                fb.super__Vector_base<Imf_3_2::FrameBuffer,_std::allocator<Imf_3_2::FrameBuffer>_>.
                _M_impl.super__Vector_impl_data._M_finish = (pointer)0xed;
                fb.super__Vector_base<Imf_3_2::FrameBuffer,_std::allocator<Imf_3_2::FrameBuffer>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)operator_new__(0x37158)
                ;
                Imf_3_2::RgbaInputFile::setFrameBuffer
                          ((Rgba *)&out,
                           (ulong)fb.
                                  super__Vector_base<Imf_3_2::FrameBuffer,_std::allocator<Imf_3_2::FrameBuffer>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,1);
                Imf_3_2::RgbaInputFile::readPixels((int)&out,0);
                puVar9 = &((fb.
                            super__Vector_base<Imf_3_2::FrameBuffer,_std::allocator<Imf_3_2::FrameBuffer>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage)->_map)._M_t._M_impl.
                          field_0x6;
                phVar14 = p2._data;
                for (lVar10 = 0; lVar10 != 0x77; lVar10 = lVar10 + 1) {
                  lVar15 = 0;
                  while (lVar15 != 0xed) {
                    fVar2 = *(float *)(_imath_half_to_float_table +
                                      (ulong)*(ushort *)(puVar9 + lVar15 * 8 + -6) * 4);
                    fVar3 = *(float *)(_imath_half_to_float_table + (ulong)phVar14[lVar15]._h * 4);
                    if ((fVar2 != fVar3) || (NAN(fVar2) || NAN(fVar3))) {
                      __assert_fail("p3[y][x].r == p2[y][x]",
                                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgba.cpp"
                                    ,0x249,
                                    "void (anonymous namespace)::writeReadLayers(const std::string &, bool)"
                                   );
                    }
                    fVar2 = *(float *)(_imath_half_to_float_table +
                                      (ulong)*(ushort *)(puVar9 + lVar15 * 8 + -4) * 4);
                    if ((fVar2 != fVar3) || (NAN(fVar2) || NAN(fVar3))) {
                      __assert_fail("p3[y][x].g == p2[y][x]",
                                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgba.cpp"
                                    ,0x24a,
                                    "void (anonymous namespace)::writeReadLayers(const std::string &, bool)"
                                   );
                    }
                    fVar2 = *(float *)(_imath_half_to_float_table +
                                      (ulong)*(ushort *)(puVar9 + lVar15 * 8 + -2) * 4);
                    if ((fVar2 != fVar3) || (NAN(fVar2) || NAN(fVar3))) {
                      __assert_fail("p3[y][x].b == p2[y][x]",
                                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgba.cpp"
                                    ,0x24b,
                                    "void (anonymous namespace)::writeReadLayers(const std::string &, bool)"
                                   );
                    }
                    fVar2 = *(float *)(_imath_half_to_float_table +
                                      (ulong)*(ushort *)(puVar9 + lVar15 * 8) * 4);
                    lVar15 = lVar15 + 1;
                    if ((fVar2 != 1.0) || (NAN(fVar2))) {
                      __assert_fail("p3[y][x].a == 1",
                                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgba.cpp"
                                    ,0x24c,
                                    "void (anonymous namespace)::writeReadLayers(const std::string &, bool)"
                                   );
                    }
                  }
                  phVar14 = phVar14 + p2._sizeY;
                  puVar9 = puVar9 + (long)fb.
                                          super__Vector_base<Imf_3_2::FrameBuffer,_std::allocator<Imf_3_2::FrameBuffer>_>
                                          ._M_impl.super__Vector_impl_data._M_finish * 8;
                }
                Imf_3_2::Array2D<Imf_3_2::Rgba>::~Array2D((Array2D<Imf_3_2::Rgba> *)&fb);
                Imf_3_2::RgbaInputFile::~RgbaInputFile((RgbaInputFile *)&out);
                _Var5 = fileName._M_dataplus;
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&fb,"",(allocator<char> *)&headers);
                iVar6 = Imf_3_2::globalThreadCount();
                Imf_3_2::RgbaInputFile::RgbaInputFile
                          ((RgbaInputFile *)&out,_Var5._M_p,(string *)&fb,iVar6);
                std::__cxx11::string::~string((string *)&fb);
                headers.super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>.
                _M_impl.super__Vector_impl_data._M_start = (pointer)0x77;
                headers.super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>.
                _M_impl.super__Vector_impl_data._M_finish = (pointer)0xed;
                headers.super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)operator_new__(0x37158)
                ;
                Imf_3_2::RgbaInputFile::setFrameBuffer
                          ((Rgba *)&out,
                           (ulong)headers.
                                  super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,1);
                Imf_3_2::RgbaInputFile::readPixels((int)&out,0);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&fb,"foo",(allocator<char> *)&part0);
                Imf_3_2::RgbaInputFile::setLayerName((string *)&out);
                std::__cxx11::string::~string((string *)&fb);
                Imf_3_2::RgbaInputFile::setFrameBuffer
                          ((Rgba *)&out,
                           (ulong)headers.
                                  super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,1);
                Imf_3_2::RgbaInputFile::readPixels((int)&out,0x3b);
                pHVar8 = headers.
                         super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage + 6;
                phVar14 = p2._data;
                phVar16 = p1._data;
                for (uVar13 = 0; uVar13 != 0x77; uVar13 = uVar13 + 1) {
                  lVar10 = 0;
                  while (lVar10 != 0xed) {
                    fVar2 = *(float *)(_imath_half_to_float_table +
                                      (ulong)*(ushort *)(pHVar8 + lVar10 * 8 + -6) * 4);
                    if (uVar13 < 0x3b) {
                      fVar3 = *(float *)(_imath_half_to_float_table + (ulong)phVar16[lVar10]._h * 4)
                      ;
                      if ((fVar2 != fVar3) || (NAN(fVar2) || NAN(fVar3))) {
                        __assert_fail("p3[y][x].r == p1[y][x]",
                                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgba.cpp"
                                      ,0x264,
                                      "void (anonymous namespace)::writeReadLayers(const std::string &, bool)"
                                     );
                      }
                      fVar2 = *(float *)(_imath_half_to_float_table +
                                        (ulong)*(ushort *)(pHVar8 + lVar10 * 8 + -4) * 4);
                      if ((fVar2 != fVar3) || (NAN(fVar2) || NAN(fVar3))) {
                        __assert_fail("p3[y][x].g == p1[y][x]",
                                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgba.cpp"
                                      ,0x265,
                                      "void (anonymous namespace)::writeReadLayers(const std::string &, bool)"
                                     );
                      }
                      fVar2 = *(float *)(_imath_half_to_float_table +
                                        (ulong)*(ushort *)(pHVar8 + lVar10 * 8 + -2) * 4);
                      if ((fVar2 != fVar3) || (NAN(fVar2) || NAN(fVar3))) {
                        __assert_fail("p3[y][x].b == p1[y][x]",
                                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgba.cpp"
                                      ,0x266,
                                      "void (anonymous namespace)::writeReadLayers(const std::string &, bool)"
                                     );
                      }
                    }
                    else {
                      fVar3 = *(float *)(_imath_half_to_float_table + (ulong)phVar14[lVar10]._h * 4)
                      ;
                      if ((fVar2 != fVar3) || (NAN(fVar2) || NAN(fVar3))) {
                        __assert_fail("p3[y][x].r == p2[y][x]",
                                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgba.cpp"
                                      ,0x26a,
                                      "void (anonymous namespace)::writeReadLayers(const std::string &, bool)"
                                     );
                      }
                      fVar2 = *(float *)(_imath_half_to_float_table +
                                        (ulong)*(ushort *)(pHVar8 + lVar10 * 8 + -4) * 4);
                      if ((fVar2 != fVar3) || (NAN(fVar2) || NAN(fVar3))) {
                        __assert_fail("p3[y][x].g == p2[y][x]",
                                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgba.cpp"
                                      ,0x26b,
                                      "void (anonymous namespace)::writeReadLayers(const std::string &, bool)"
                                     );
                      }
                      fVar2 = *(float *)(_imath_half_to_float_table +
                                        (ulong)*(ushort *)(pHVar8 + lVar10 * 8 + -2) * 4);
                      if ((fVar2 != fVar3) || (NAN(fVar2) || NAN(fVar3))) {
                        __assert_fail("p3[y][x].b == p2[y][x]",
                                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgba.cpp"
                                      ,0x26c,
                                      "void (anonymous namespace)::writeReadLayers(const std::string &, bool)"
                                     );
                      }
                    }
                    fVar2 = *(float *)(_imath_half_to_float_table +
                                      (ulong)*(ushort *)(pHVar8 + lVar10 * 8) * 4);
                    lVar10 = lVar10 + 1;
                    if ((fVar2 != 1.0) || (NAN(fVar2))) {
                      __assert_fail("p3[y][x].a == 1",
                                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgba.cpp"
                                    ,0x26f,
                                    "void (anonymous namespace)::writeReadLayers(const std::string &, bool)"
                                   );
                    }
                  }
                  pHVar8 = pHVar8 + (long)headers.
                                          super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>
                                          ._M_impl.super__Vector_impl_data._M_finish * 8;
                  phVar16 = phVar16 + p1._sizeY;
                  phVar14 = phVar14 + p2._sizeY;
                }
                Imf_3_2::Array2D<Imf_3_2::Rgba>::~Array2D((Array2D<Imf_3_2::Rgba> *)&headers);
                Imf_3_2::RgbaInputFile::~RgbaInputFile((RgbaInputFile *)&out);
              }
              remove(fileName._M_dataplus._M_p);
              Imf_3_2::Array2D<Imath_3_2::half>::~Array2D(&p2);
              Imf_3_2::Array2D<Imath_3_2::half>::~Array2D(&p1);
              std::__cxx11::string::~string((string *)&fileName);
              return;
            }
            lVar10 = 0;
            while (lVar10 != 0xed) {
              fVar2 = *(float *)(_imath_half_to_float_table +
                                (ulong)*(ushort *)(pHVar8 + lVar10 * 8 + -6) * 4);
              if (uVar13 < 0x3b) {
                pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar16[lVar10]._h * 4);
                if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
                  __assert_fail("p3[y][x].r == p1[y][x]",
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgba.cpp"
                                ,0x202,
                                "void (anonymous namespace)::writeReadLayers(const std::string &, bool)"
                               );
                }
              }
              else {
                pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar14[lVar10]._h * 4);
                if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
                  __assert_fail("p3[y][x].r == p2[y][x]",
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgba.cpp"
                                ,0x204,
                                "void (anonymous namespace)::writeReadLayers(const std::string &, bool)"
                               );
                }
              }
              fVar2 = *(float *)(_imath_half_to_float_table +
                                (ulong)*(ushort *)(pHVar8 + lVar10 * 8 + -4) * 4);
              if ((fVar2 != 0.0) || (NAN(fVar2))) {
                __assert_fail("p3[y][x].g == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgba.cpp"
                              ,0x206,
                              "void (anonymous namespace)::writeReadLayers(const std::string &, bool)"
                             );
              }
              fVar2 = *(float *)(_imath_half_to_float_table +
                                (ulong)*(ushort *)(pHVar8 + lVar10 * 8 + -2) * 4);
              if ((fVar2 != 0.0) || (NAN(fVar2))) {
                __assert_fail("p3[y][x].b == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgba.cpp"
                              ,0x207,
                              "void (anonymous namespace)::writeReadLayers(const std::string &, bool)"
                             );
              }
              fVar2 = *(float *)(_imath_half_to_float_table +
                                (ulong)*(ushort *)(pHVar8 + lVar10 * 8) * 4);
              lVar10 = lVar10 + 1;
              if ((fVar2 != 1.0) || (NAN(fVar2))) {
                __assert_fail("p3[y][x].a == 1",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgba.cpp"
                              ,0x208,
                              "void (anonymous namespace)::writeReadLayers(const std::string &, bool)"
                             );
              }
            }
            uVar13 = uVar13 + 1;
            pHVar8 = pHVar8 + (long)headers.
                                    super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>
                                    ._M_impl.super__Vector_impl_data._M_finish * 8;
            phVar16 = phVar16 + p1._sizeY;
            phVar14 = phVar14 + p2._sizeY;
          } while( true );
        }
        lVar15 = 0;
        while (lVar15 != 0xed) {
          fVar2 = *(float *)(_imath_half_to_float_table +
                            (ulong)*(ushort *)(pHVar8 + lVar15 * 8 + -6) * 4);
          pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar14[lVar15]._h * 4);
          if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
            __assert_fail("p3[y][x].r == p2[y][x]",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgba.cpp"
                          ,0x1db,
                          "void (anonymous namespace)::writeReadLayers(const std::string &, bool)");
          }
          fVar2 = *(float *)(_imath_half_to_float_table +
                            (ulong)*(ushort *)(pHVar8 + lVar15 * 8 + -4) * 4);
          if ((fVar2 != 0.0) || (NAN(fVar2))) {
            __assert_fail("p3[y][x].g == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgba.cpp"
                          ,0x1dc,
                          "void (anonymous namespace)::writeReadLayers(const std::string &, bool)");
          }
          fVar2 = *(float *)(_imath_half_to_float_table +
                            (ulong)*(ushort *)(pHVar8 + lVar15 * 8 + -2) * 4);
          if ((fVar2 != 0.0) || (NAN(fVar2))) {
            __assert_fail("p3[y][x].b == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgba.cpp"
                          ,0x1dd,
                          "void (anonymous namespace)::writeReadLayers(const std::string &, bool)");
          }
          fVar2 = *(float *)(_imath_half_to_float_table +
                            (ulong)*(ushort *)(pHVar8 + lVar15 * 8) * 4);
          lVar15 = lVar15 + 1;
          if ((fVar2 != 1.0) || (NAN(fVar2))) {
            __assert_fail("p3[y][x].a == 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgba.cpp"
                          ,0x1de,
                          "void (anonymous namespace)::writeReadLayers(const std::string &, bool)");
          }
        }
        lVar10 = lVar10 + 1;
        phVar14 = phVar14 + p2._sizeY;
        pHVar8 = pHVar8 + (long)headers.
                                super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>
                                ._M_impl.super__Vector_impl_data._M_finish * 8;
      } while( true );
    }
    lVar15 = 0;
    while (lVar15 != 0xed) {
      fVar2 = *(float *)(_imath_half_to_float_table +
                        (ulong)*(ushort *)(pHVar8 + lVar15 * 8 + -6) * 4);
      pfVar1 = (float *)(_imath_half_to_float_table + (ulong)phVar14[lVar15]._h * 4);
      if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
        __assert_fail("p3[y][x].r == p1[y][x]",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgba.cpp"
                      ,0x1be,
                      "void (anonymous namespace)::writeReadLayers(const std::string &, bool)");
      }
      fVar2 = *(float *)(_imath_half_to_float_table +
                        (ulong)*(ushort *)(pHVar8 + lVar15 * 8 + -4) * 4);
      if ((fVar2 != 0.0) || (NAN(fVar2))) {
        __assert_fail("p3[y][x].g == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgba.cpp"
                      ,0x1bf,
                      "void (anonymous namespace)::writeReadLayers(const std::string &, bool)");
      }
      fVar2 = *(float *)(_imath_half_to_float_table +
                        (ulong)*(ushort *)(pHVar8 + lVar15 * 8 + -2) * 4);
      if ((fVar2 != 0.0) || (NAN(fVar2))) {
        __assert_fail("p3[y][x].b == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgba.cpp"
                      ,0x1c0,
                      "void (anonymous namespace)::writeReadLayers(const std::string &, bool)");
      }
      fVar2 = *(float *)(_imath_half_to_float_table + (ulong)*(ushort *)(pHVar8 + lVar15 * 8) * 4);
      lVar15 = lVar15 + 1;
      if ((fVar2 != 1.0) || (NAN(fVar2))) {
        __assert_fail("p3[y][x].a == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgba.cpp"
                      ,0x1c1,
                      "void (anonymous namespace)::writeReadLayers(const std::string &, bool)");
      }
    }
    lVar10 = lVar10 + 1;
    phVar14 = phVar14 + p1._sizeY;
    pHVar8 = pHVar8 + (long)headers.
                            super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>.
                            _M_impl.super__Vector_impl_data._M_finish * 8;
  } while( true );
}

Assistant:

void
writeReadLayers (const std::string& tempDir, bool multiPart)
{
    if (multiPart) { cout << "\nreading multi-part file" << endl; }
    else
    {
        cout << "\nreading multi-layer file" << endl;
    }

    std::string fileName = tempDir + "imf_test_multi_layer_rgba.exr";

    const int W = 237;
    const int H = 119;

    Array2D<half> p1 (H, W);
    Array2D<half> p2 (H, W);

    int partForFooLayer = 0;

    if (multiPart) { partForFooLayer = 1; }

    for (int y = 0; y < H; ++y)
    {
        for (int x = 0; x < W; ++x)
        {
            p1[y][x] = half (y % 23 + x % 17);
            p2[y][x] = half (y % 29 + x % 19);
        }
    }

    {

        std::vector<Header> headers (2);
        {
            Header hdr (W, H);
            hdr.setType (SCANLINEIMAGE);
            headers[0] = hdr;
            headers[0].setName ("rgba_layer");
            if (multiPart)
            {
                headers[1] = hdr;
                headers[1].setName ("foo_layer");
            }
        }

        headers[0].channels ().insert ("R", Channel (HALF));
        headers[partForFooLayer].channels ().insert ("foo.R", Channel (HALF));

        vector<FrameBuffer> fb (2);

        fb[0].insert (
            "R",
            Slice (
                HALF,                // type
                (char*) &p1[0][0],   // base
                sizeof (half),       // xStride
                sizeof (half) * W)); // yStride

        fb[partForFooLayer].insert (
            "foo.R",
            Slice (
                HALF,                // type
                (char*) &p2[0][0],   // base
                sizeof (half),       // xStride
                sizeof (half) * W)); // yStride

        MultiPartOutputFile out (
            fileName.c_str (), headers.data (), multiPart ? 2 : 1);
        OutputPart part0 = OutputPart (out, 0);
        part0.setFrameBuffer (fb[0]);
        part0.writePixels (H);
        if (multiPart)
        {
            OutputPart part1 = OutputPart (out, 1);
            part1.setFrameBuffer (fb[1]);
            part1.writePixels (H);
        }
    }

    {

        Array2D<Rgba> p3 (H, W);
        if (multiPart)
        {
            RgbaInputFile in (fileName.c_str (), "");
            in.setFrameBuffer (&p3[0][0], 1, W);
            in.readPixels (0, H - 1);
        }
        else
        {
            RgbaInputFile in (0, fileName.c_str (), "");
            in.setFrameBuffer (&p3[0][0], 1, W);
            in.readPixels (0, H - 1);
        }

        for (int y = 0; y < H; ++y)
        {
            for (int x = 0; x < W; ++x)
            {
                assert (p3[y][x].r == p1[y][x]);
                assert (p3[y][x].g == 0);
                assert (p3[y][x].b == 0);
                assert (p3[y][x].a == 1);
            }
        }
    }

    {

        Array2D<Rgba> p3 (H, W);

        if (multiPart)
        {
            RgbaInputFile in (1, fileName.c_str (), "foo");
            in.setFrameBuffer (&p3[0][0], 1, W);
            in.readPixels (0, H - 1);
        }
        else
        {
            RgbaInputFile in (fileName.c_str (), "foo");
            in.setFrameBuffer (&p3[0][0], 1, W);
            in.readPixels (0, H - 1);
        }

        for (int y = 0; y < H; ++y)
        {
            for (int x = 0; x < W; ++x)
            {
                assert (p3[y][x].r == p2[y][x]);
                assert (p3[y][x].g == 0);
                assert (p3[y][x].b == 0);
                assert (p3[y][x].a == 1);
            }
        }
    }

    {
        Array2D<Rgba> p3 (H, W);
        if (multiPart)
        {
            RgbaInputFile in (fileName.c_str (), "");
            in.setFrameBuffer (&p3[0][0], 1, W);
            in.readPixels (0, H / 2 - 1);

            in.setPartAndLayer (1, "foo");

            in.setFrameBuffer (&p3[0][0], 1, W);
            in.readPixels (H / 2, H - 1);
        }
        else
        {
            RgbaInputFile in (fileName.c_str (), "");

            in.setFrameBuffer (&p3[0][0], 1, W);
            in.readPixels (0, H / 2 - 1);

            in.setLayerName ("foo");

            in.setFrameBuffer (&p3[0][0], 1, W);
            in.readPixels (H / 2, H - 1);
        }

        for (int y = 0; y < H; ++y)
        {
            for (int x = 0; x < W; ++x)
            {
                if (y < H / 2)
                    assert (p3[y][x].r == p1[y][x]);
                else
                    assert (p3[y][x].r == p2[y][x]);

                assert (p3[y][x].g == 0);
                assert (p3[y][x].b == 0);
                assert (p3[y][x].a == 1);
            }
        }
    }

    if (!multiPart)
    {
        {
            Header hdr (W, H);
            hdr.channels ().insert ("Y", Channel (HALF));
            hdr.channels ().insert ("foo.Y", Channel (HALF));

            FrameBuffer fb;

            fb.insert (
                "Y",
                Slice (
                    HALF,                // type
                    (char*) &p1[0][0],   // base
                    sizeof (half),       // xStride
                    sizeof (half) * W)); // yStride

            fb.insert (
                "foo.Y",
                Slice (
                    HALF,                // type
                    (char*) &p2[0][0],   // base
                    sizeof (half),       // xStride
                    sizeof (half) * W)); // yStride

            OutputFile out (fileName.c_str (), hdr);
            out.setFrameBuffer (fb);
            out.writePixels (H);
        }

        {
            RgbaInputFile in (fileName.c_str (), "");

            Array2D<Rgba> p3 (H, W);
            in.setFrameBuffer (&p3[0][0], 1, W);
            in.readPixels (0, H - 1);

            for (int y = 0; y < H; ++y)
            {
                for (int x = 0; x < W; ++x)
                {
                    assert (p3[y][x].r == p1[y][x]);
                    assert (p3[y][x].g == p1[y][x]);
                    assert (p3[y][x].b == p1[y][x]);
                    assert (p3[y][x].a == 1);
                }
            }
        }

        {
            RgbaInputFile in (fileName.c_str (), "foo");

            Array2D<Rgba> p3 (H, W);
            in.setFrameBuffer (&p3[0][0], 1, W);
            in.readPixels (0, H - 1);

            for (int y = 0; y < H; ++y)
            {
                for (int x = 0; x < W; ++x)
                {
                    assert (p3[y][x].r == p2[y][x]);
                    assert (p3[y][x].g == p2[y][x]);
                    assert (p3[y][x].b == p2[y][x]);
                    assert (p3[y][x].a == 1);
                }
            }
        }

        {
            RgbaInputFile in (fileName.c_str (), "");

            Array2D<Rgba> p3 (H, W);

            in.setFrameBuffer (&p3[0][0], 1, W);
            in.readPixels (0, H / 2 - 1);

            in.setLayerName ("foo");

            in.setFrameBuffer (&p3[0][0], 1, W);
            in.readPixels (H / 2, H - 1);

            for (int y = 0; y < H; ++y)
            {
                for (int x = 0; x < W; ++x)
                {
                    if (y < H / 2)
                    {
                        assert (p3[y][x].r == p1[y][x]);
                        assert (p3[y][x].g == p1[y][x]);
                        assert (p3[y][x].b == p1[y][x]);
                    }
                    else
                    {
                        assert (p3[y][x].r == p2[y][x]);
                        assert (p3[y][x].g == p2[y][x]);
                        assert (p3[y][x].b == p2[y][x]);
                    }

                    assert (p3[y][x].a == 1);
                }
            }
        }
    }

    remove (fileName.c_str ());
}